

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fill<kj::ArrayPtr<char_const>,kj::StringPtr&>
                 (char *target,ArrayPtr<const_char> *first,StringPtr *rest)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = first->ptr;
  sVar1 = first->size_;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    target[sVar2] = pcVar3[sVar2];
  }
  pcVar3 = fill<kj::StringPtr>(target + sVar2,rest);
  return pcVar3;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }